

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cc
# Opt level: O0

TimeTscPair absl::lts_20240722::base_internal::GetTimeTscPair(void)

{
  TimeTscPair TVar1;
  int64_t iVar2;
  int64_t iVar3;
  int64_t iVar4;
  int64_t latency;
  int64_t t1;
  int64_t tsc;
  int64_t t0;
  long lStack_20;
  int i;
  int64_t best_latency;
  TimeTscPair best;
  
  lStack_20 = std::numeric_limits<long>::max();
  for (t0._4_4_ = 0; t0._4_4_ < 10; t0._4_4_ = t0._4_4_ + 1) {
    iVar2 = ReadMonotonicClockNanos();
    iVar3 = UnscaledCycleClockWrapperForInitializeFrequency::Now();
    iVar4 = ReadMonotonicClockNanos();
    if (iVar4 - iVar2 < lStack_20) {
      lStack_20 = iVar4 - iVar2;
      best_latency = iVar2;
      best.time = iVar3;
    }
  }
  TVar1.tsc = best.time;
  TVar1.time = best_latency;
  return TVar1;
}

Assistant:

static TimeTscPair GetTimeTscPair() {
  int64_t best_latency = std::numeric_limits<int64_t>::max();
  TimeTscPair best;
  for (int i = 0; i < 10; ++i) {
    int64_t t0 = ReadMonotonicClockNanos();
    int64_t tsc = UnscaledCycleClockWrapperForInitializeFrequency::Now();
    int64_t t1 = ReadMonotonicClockNanos();
    int64_t latency = t1 - t0;
    if (latency < best_latency) {
      best_latency = latency;
      best.time = t0;
      best.tsc = tsc;
    }
  }
  return best;
}